

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O1

int context_add_value(context_t *ctx,yajl_val v)

{
  char **ppcVar1;
  yajl_type yVar2;
  stack_elem_t *psVar3;
  yajl_val pyVar4;
  size_t sVar5;
  char *pcVar6;
  yajl_val *ppyVar7;
  char *pcVar8;
  size_t __maxlen;
  
  psVar3 = ctx->stack;
  if (psVar3 == (stack_elem_t *)0x0) {
    ctx->root = v;
    return 0;
  }
  pyVar4 = psVar3->value;
  if (pyVar4 != (yajl_val)0x0) {
    if (pyVar4->type == yajl_t_object) {
      pcVar8 = psVar3->key;
      if (pcVar8 != (char *)0x0) {
        psVar3->key = (char *)0x0;
        pcVar6 = (char *)realloc((pyVar4->u).string,(pyVar4->u).object.len * 8 + 8);
        if (pcVar6 != (char *)0x0) {
          (pyVar4->u).string = pcVar6;
          ppyVar7 = (yajl_val *)realloc((pyVar4->u).object.values,(pyVar4->u).object.len * 8 + 8);
          if (ppyVar7 != (yajl_val *)0x0) {
            (pyVar4->u).object.values = ppyVar7;
            *(char **)((pyVar4->u).string + (pyVar4->u).object.len * 8) = pcVar8;
            (pyVar4->u).object.values[(pyVar4->u).object.len] = v;
            ppcVar1 = &(pyVar4->u).number.r;
            *ppcVar1 = *ppcVar1 + 1;
            return 0;
          }
        }
        goto LAB_00106651;
      }
      yVar2 = v->type;
      if (yVar2 == yajl_t_string) {
        psVar3->key = (v->u).string;
        (v->u).string = (char *)0x0;
        free(v);
        return 0;
      }
      pcVar8 = ctx->errbuf;
      if (pcVar8 == (char *)0x0) {
        return 0x16;
      }
      __maxlen = ctx->errbuf_size;
      pcVar6 = "context_add_value: Object key is not a string (%#04x)";
      goto LAB_0010663c;
    }
    if ((pyVar4 != (yajl_val)0x0) && (pyVar4->type == yajl_t_array)) {
      pcVar8 = (char *)realloc((pyVar4->u).string,(pyVar4->u).array.len * 8 + 8);
      if (pcVar8 != (char *)0x0) {
        (pyVar4->u).string = pcVar8;
        sVar5 = (pyVar4->u).array.len;
        *(yajl_val *)(pcVar8 + sVar5 * 8) = v;
        (pyVar4->u).object.values = (yajl_val *)(sVar5 + 1);
        return 0;
      }
LAB_00106651:
      if (ctx->errbuf != (char *)0x0) {
        snprintf(ctx->errbuf,ctx->errbuf_size,"Out of memory");
        return 0xc;
      }
      return 0xc;
    }
  }
  pcVar8 = ctx->errbuf;
  if (pcVar8 == (char *)0x0) {
    return 0x16;
  }
  __maxlen = ctx->errbuf_size;
  yVar2 = pyVar4->type;
  pcVar6 = "context_add_value: Cannot add value to a value of type %#04x (not a composite type)";
LAB_0010663c:
  snprintf(pcVar8,__maxlen,pcVar6,(ulong)yVar2);
  return 0x16;
}

Assistant:

static int context_add_value (context_t *ctx, yajl_val v)
{
    /* We're checking for NULL values in all the calling functions. */
    assert (ctx != NULL);
    assert (v != NULL);

    /*
     * There are three valid states in which this function may be called:
     *   - There is no value on the stack => This is the only value. This is the
     *     last step done when parsing a document. We assign the value to the
     *     "root" member and return.
     *   - The value on the stack is an object. In this case store the key on the
     *     stack or, if the key has already been read, add key and value to the
     *     object.
     *   - The value on the stack is an array. In this case simply add the value
     *     and return.
     */
    if (ctx->stack == NULL)
    {
        assert (ctx->root == NULL);
        ctx->root = v;
        return (0);
    }
    else if (YAJL_IS_OBJECT (ctx->stack->value))
    {
        if (ctx->stack->key == NULL)
        {
            if (!YAJL_IS_STRING (v))
                RETURN_ERROR (ctx, EINVAL, "context_add_value: "
                              "Object key is not a string (%#04x)",
                              v->type);

            ctx->stack->key = v->u.string;
            v->u.string = NULL;
            free(v);
            return (0);
        }
        else /* if (ctx->key != NULL) */
        {
            char * key;

            key = ctx->stack->key;
            ctx->stack->key = NULL;
            return (object_add_keyval (ctx, ctx->stack->value, key, v));
        }
    }
    else if (YAJL_IS_ARRAY (ctx->stack->value))
    {
        return (array_add_value (ctx, ctx->stack->value, v));
    }
    else
    {
        RETURN_ERROR (ctx, EINVAL, "context_add_value: Cannot add value to "
                      "a value of type %#04x (not a composite type)",
                      ctx->stack->value->type);
    }
}